

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# greg.c
# Opt level: O1

int yyparse_from(GREG *G,yyrule yystart)

{
  int end;
  int iVar1;
  int iVar2;
  char *pcVar3;
  yythunk *pyVar4;
  int *piVar5;
  long lVar6;
  long lVar7;
  
  if (G->buflen == 0) {
    G->buflen = 0x400;
    pcVar3 = (char *)malloc(0x400);
    G->buf = pcVar3;
    G->textlen = 0x400;
    pcVar3 = (char *)malloc(0x400);
    G->text = pcVar3;
    G->thunkslen = 0x80;
    pyVar4 = (yythunk *)malloc(0x1000);
    G->thunks = pyVar4;
    G->valslen = 0x80;
    piVar5 = (int *)malloc(0x200);
    G->vals = piVar5;
    G->thunkpos = 0;
    G->pos = 0;
    G->limit = 0;
    G->begin = 0;
    G->end = 0;
  }
  G->pos = 0;
  G->begin = 0;
  G->end = 0;
  G->thunkpos = 0;
  G->val = G->vals;
  iVar1 = (*yystart)(G);
  if (iVar1 != 0) {
    if (0 < G->thunkpos) {
      lVar6 = 0;
      lVar7 = 0;
      do {
        pyVar4 = G->thunks;
        iVar2 = *(int *)((long)&pyVar4->begin + lVar6);
        end = *(int *)((long)&pyVar4->end + lVar6);
        if (end != 0) {
          iVar2 = yyText(G,iVar2,end);
        }
        (**(code **)((long)&pyVar4->action + lVar6))
                  (G,G->text,iVar2,(long)&pyVar4->begin + lVar6,G->data);
        lVar7 = lVar7 + 1;
        lVar6 = lVar6 + 0x20;
      } while (lVar7 < G->thunkpos);
    }
    G->thunkpos = 0;
  }
  iVar2 = G->limit - G->pos;
  G->limit = iVar2;
  if (iVar2 != 0) {
    memmove(G->buf,G->buf + G->pos,(long)iVar2);
  }
  iVar2 = G->pos;
  G->offset = G->offset + iVar2;
  G->begin = G->begin - iVar2;
  G->end = G->end - iVar2;
  G->thunkpos = 0;
  G->pos = 0;
  return iVar1;
}

Assistant:

YY_PARSE(int) YY_NAME(parse_from)(GREG *G, yyrule yystart)
{
  int yyok;
  if (!G->buflen)
    {
      G->buflen= YY_BUFFER_START_SIZE;
      G->buf= (char*)YY_ALLOC(G->buflen, G->data);
      G->textlen= YY_BUFFER_START_SIZE;
      G->text= (char*)YY_ALLOC(G->textlen, G->data);
      G->thunkslen= YY_STACK_SIZE;
      G->thunks= (yythunk*)YY_ALLOC(sizeof(yythunk) * G->thunkslen, G->data);
      G->valslen= YY_STACK_SIZE;
      G->vals= (YYSTYPE*)YY_ALLOC(sizeof(YYSTYPE) * G->valslen, G->data);
      G->begin= G->end= G->pos= G->limit= G->thunkpos= 0;
    }
  G->pos = 0;
  G->begin= G->end= G->pos;
  G->thunkpos= 0;
  G->val= G->vals;
  yyok= yystart(G);
  if (yyok) yyDone(G);
  yyCommit(G);
  return yyok;
  (void)yyrefill;
  (void)yymatchDot;
  (void)yymatchChar;
  (void)yymatchString;
  (void)yymatchClass;
  (void)yyDo;
  (void)yyText;
  (void)yyDone;
  (void)yyCommit;
  (void)yyAccept;
  (void)yyPush;
  (void)yyPop;
  (void)yySet;
}